

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directionalscannero1.cpp
# Opt level: O0

int __thiscall
DirectionalScannerO1::nextOnRight
          (DirectionalScannerO1 *this,vector<Pt2i,_std::allocator<Pt2i>_> *scan)

{
  bool bVar1;
  vector<Pt2i,_std::allocator<Pt2i>_> *this_00;
  bool *pbVar2;
  size_type sVar3;
  Pt2i local_30;
  bool *local_28;
  bool *nst;
  int y;
  int x;
  vector<Pt2i,_std::allocator<Pt2i>_> *scan_local;
  DirectionalScannerO1 *this_local;
  
  _y = (vector<Pt2i,_std::allocator<Pt2i>_> *)scan;
  scan_local = (vector<Pt2i,_std::allocator<Pt2i>_> *)this;
  if (((this->super_DirectionalScanner).clearance & 1U) != 0) {
    std::vector<Pt2i,_std::allocator<Pt2i>_>::clear(scan);
  }
  if ((this->rstop & 1U) == 0) {
    (this->super_DirectionalScanner).rcx = (this->super_DirectionalScanner).rcx + 1;
    if ((*this->rst1 & 1U) != 0) {
      if ((*(this->super_DirectionalScanner).rst2 & 1U) != 0) {
        (this->super_DirectionalScanner).rcx = (this->super_DirectionalScanner).rcx + -1;
        this->rstop = true;
      }
      (this->super_DirectionalScanner).rcy = (this->super_DirectionalScanner).rcy + 1;
      pbVar2 = (this->super_DirectionalScanner).rst2 + 1;
      (this->super_DirectionalScanner).rst2 = pbVar2;
      if ((this->super_DirectionalScanner).fs <= pbVar2) {
        (this->super_DirectionalScanner).rst2 = (this->super_DirectionalScanner).steps;
      }
    }
    pbVar2 = this->rst1;
    this->rst1 = pbVar2 + 1;
    if ((this->super_DirectionalScanner).fs <= pbVar2 + 1) {
      this->rst1 = (this->super_DirectionalScanner).steps;
    }
  }
  else {
    (this->super_DirectionalScanner).rcx = (this->super_DirectionalScanner).rcx + 1;
    this->rstop = false;
  }
  nst._4_4_ = (this->super_DirectionalScanner).rcx;
  nst._0_4_ = (this->super_DirectionalScanner).rcy;
  local_28 = (this->super_DirectionalScanner).rst2;
  while( true ) {
    if (((this->super_DirectionalScanner).xmax <= nst._4_4_) ||
       (bVar1 = false, (int)nst < (this->super_DirectionalScanner).ymin)) {
      bVar1 = (this->super_DirectionalScanner).dlc2 <=
              (this->super_DirectionalScanner).dla * nst._4_4_ +
              (this->super_DirectionalScanner).dlb * (int)nst;
    }
    if (!bVar1) break;
    if ((*local_28 & 1U) != 0) {
      nst._4_4_ = nst._4_4_ + -1;
    }
    nst._0_4_ = (int)nst + 1;
    local_28 = local_28 + 1;
    if ((this->super_DirectionalScanner).fs <= local_28) {
      local_28 = (this->super_DirectionalScanner).steps;
    }
  }
  while( true ) {
    this_00 = _y;
    bVar1 = false;
    if (((this->super_DirectionalScanner).dlc2 <=
         (this->super_DirectionalScanner).dla * nst._4_4_ +
         (this->super_DirectionalScanner).dlb * (int)nst) &&
       (bVar1 = false, (this->super_DirectionalScanner).xmin <= nst._4_4_)) {
      bVar1 = (int)nst < (this->super_DirectionalScanner).ymax;
    }
    if (!bVar1) break;
    Pt2i::Pt2i(&local_30,nst._4_4_,(int)nst);
    std::vector<Pt2i,_std::allocator<Pt2i>_>::push_back
              ((vector<Pt2i,_std::allocator<Pt2i>_> *)this_00,&local_30);
    Pt2i::~Pt2i(&local_30);
    if ((*local_28 & 1U) != 0) {
      nst._4_4_ = nst._4_4_ + -1;
    }
    nst._0_4_ = (int)nst + 1;
    local_28 = local_28 + 1;
    if ((this->super_DirectionalScanner).fs <= local_28) {
      local_28 = (this->super_DirectionalScanner).steps;
    }
  }
  sVar3 = CLI::std::vector<Pt2i,_std::allocator<Pt2i>_>::size(_y);
  return (int)sVar3;
}

Assistant:

int DirectionalScannerO1::nextOnRight (std::vector<Pt2i> &scan)
{
  // Prepares the next scan
  if (clearance) scan.clear ();
  if (rstop)
  {
    rcx ++;
    rstop = false;
  }
  else
  {
    rcx ++;
    if (*rst1)
    {
      if (*rst2)
      {
        rcx --;
        rstop = true;
      }
      rcy ++;
      if (++rst2 >= fs) rst2 = steps;
    }
    if (++rst1 >= fs) rst1 = steps;
  }

  // Computes the next scan
  int x = rcx;
  int y = rcy;
  bool *nst = rst2;
  while ((x >= xmax || y < ymin) && dla * x + dlb * y >= dlc2)
  {
    if (*nst) x--;
    y++;
    if (++nst >= fs) nst = steps;
  }
  while (dla * x + dlb * y >= dlc2 && x >= xmin && y < ymax)
  {
    scan.push_back (Pt2i (x, y));
    if (*nst) x--;
    y++;
    if (++nst >= fs) nst = steps;
  }
  return ((int) (scan.size ()));
}